

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender-c.cpp
# Opt level: O3

duckdb_logical_type duckdb_appender_column_type(duckdb_appender appender,idx_t col_idx)

{
  idx_t iVar1;
  pointer this;
  vector<duckdb::LogicalType,_true> *this_00;
  const_reference other;
  LogicalType *this_01;
  
  if (((appender != (duckdb_appender)0x0) &&
      (iVar1 = duckdb_appender_column_count(appender), col_idx < iVar1)) && (*(long *)appender != 0)
     ) {
    this = duckdb::unique_ptr<duckdb::Appender,_std::default_delete<duckdb::Appender>,_true>::
           operator->((unique_ptr<duckdb::Appender,_std::default_delete<duckdb::Appender>,_true> *)
                      appender);
    this_00 = duckdb::BaseAppender::GetActiveTypes(&this->super_BaseAppender);
    other = duckdb::vector<duckdb::LogicalType,_true>::operator[](this_00,col_idx);
    this_01 = (LogicalType *)operator_new(0x18);
    duckdb::LogicalType::LogicalType(this_01,other);
    return (duckdb_logical_type)this_01;
  }
  return (duckdb_logical_type)0x0;
}

Assistant:

duckdb_logical_type duckdb_appender_column_type(duckdb_appender appender, idx_t col_idx) {
	if (!appender || col_idx >= duckdb_appender_column_count(appender)) {
		return nullptr;
	}

	auto wrapper = reinterpret_cast<AppenderWrapper *>(appender);
	if (!wrapper->appender) {
		return nullptr;
	}

	auto &logical_type = wrapper->appender->GetActiveTypes()[col_idx];
	return reinterpret_cast<duckdb_logical_type>(new duckdb::LogicalType(logical_type));
}